

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O0

bool __thiscall QtWidgetsShortcutPrivate::handleWhatsThis(QtWidgetsShortcutPrivate *this)

{
  long lVar1;
  bool bVar2;
  QPoint *pos;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWhatsThis::inWhatsThisMode();
  if (bVar2) {
    pos = (QPoint *)QCursor::pos();
    QWhatsThis::showText
              (pos,(QString *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QtWidgetsShortcutPrivate::handleWhatsThis()
{
#if QT_CONFIG(whatsthis)
    if (QWhatsThis::inWhatsThisMode()) {
        QWhatsThis::showText(QCursor::pos(), sc_whatsthis);
        return true;
    }
#endif
    return false;
}